

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O0

void __thiscall
burst::
semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
::settle(semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
         *this)

{
  size_t sVar1;
  semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  *this_local;
  
  remove_empty_ranges(this);
  sVar1 = range_count(this);
  if (sVar1 < this->m_min_items) {
    scroll_to_end(this);
  }
  else {
    maintain_invariant(this);
    next_semiintersection(this);
  }
  return;
}

Assistant:

void settle ()
        {
            remove_empty_ranges();
            if (range_count() >= m_min_items)
            {
                maintain_invariant();
                next_semiintersection();
            }
            else
            {
                scroll_to_end();
            }
        }